

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

string * cm::operator+=(string *s,
                       StringOpPlus<const_cm::StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *a)

{
  std::__cxx11::string::reserve((ulong)s);
  operator+=(s,a->l);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)s,&a->r);
  return s;
}

Assistant:

std::string& operator+=(std::string& s, StringOpPlus<L, R> const& a)
{
  s.reserve(s.size() + a.size());
  s += a.l;
  s += a.r;
  return s;
}